

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thr_unlink.c
# Opt level: O3

void * rm_thread_forward(void *objs_ptr)

{
  int iVar1;
  int iVar2;
  ll_elem *plVar3;
  ll_elem *plVar4;
  undefined8 extraout_RAX;
  int *piVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar6;
  
  lVar6 = 8;
  do {
    ll_ref(&list.ll_head,(ll_elem *)((long)objs_ptr + lVar6));
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0x7d08);
  iVar1 = pthread_barrier_wait((pthread_barrier_t *)&barrier);
  iVar2 = 0;
  if (iVar1 != -1) {
    iVar2 = iVar1;
  }
  must_succeed(iVar2,"pthread_barrier_wait");
  lVar6 = 1000;
  do {
    plVar3 = ll_unlink(&list.ll_head,(ll_elem *)((long)objs_ptr + 8),1);
    if (((ulong)plVar3 & 0xfffffffffffffff7) == 0) {
      rm_thread_forward_cold_1();
      lVar6 = 8;
      do {
        ll_ref(&list.ll_head,(ll_elem *)((long)objs_ptr + lVar6));
        lVar6 = lVar6 + 0x20;
      } while (lVar6 != 0x7d08);
      iVar2 = pthread_barrier_wait((pthread_barrier_t *)&barrier);
      lVar6 = 0;
      if (iVar2 == -1) {
        iVar2 = 0;
      }
      must_succeed(iVar2,"pthread_barrier_wait");
      plVar3 = (ll_elem *)((long)objs_ptr + 0x7ce8);
      do {
        plVar4 = ll_unlink(&list.ll_head,plVar3,1);
        if (((ulong)plVar4 & 0xfffffffffffffff7) == 0) {
          piVar5 = (int *)((long)objs_ptr + (0x7ce0 - lVar6));
          rm_thread_backward_cold_1();
          fprintf(_stderr,"Failed to remove object[%d][%d]\n",(ulong)(uint)(*piVar5 / 1000),
                  (ulong)(uint)(*piVar5 % 1000),in_R8,in_R9,extraout_RAX);
          abort();
        }
        lVar6 = lVar6 + 0x20;
        plVar3 = (ll_elem *)&plVar3[-2].refcnt;
      } while (lVar6 != 32000);
      return (void *)0x0;
    }
    objs_ptr = (void *)((long)objs_ptr + 0x20);
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  return (void *)0x0;
}

Assistant:

void*
rm_thread_forward(void *objs_ptr)
{
	struct obj *objs = objs_ptr;
	int i;

	for (i = 0; i < N; i++)
		LL_REF(objlist, &list, &objs[i]);
	must_succeed(barrier_wait(&barrier), "pthread_barrier_wait");

	for (i = 0; i < N; i++) {
		if (!LL_UNLINK(objlist, &list, &objs[i]))
			unlink_fail(&objs[i]);
	}
	return NULL;
}